

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

QPDF_ERROR_CODE trap_errors(qpdf_data qpdf,function<void_(_qpdf_data_*)> *fn)

{
  QPDF_BOOL QVar1;
  
  std::function<void_(_qpdf_data_*)>::operator()(fn,qpdf);
  QVar1 = qpdf_more_warnings(qpdf);
  return QVar1;
}

Assistant:

static QPDF_ERROR_CODE
trap_errors(qpdf_data qpdf, std::function<void(qpdf_data)> fn)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    try {
        fn(qpdf);
    } catch (QPDFExc& e) {
        qpdf->error = std::make_shared<QPDFExc>(e);
        status |= QPDF_ERRORS;
    } catch (std::runtime_error& e) {
        qpdf->error = std::make_shared<QPDFExc>(qpdf_e_system, "", "", 0, e.what());
        status |= QPDF_ERRORS;
    } catch (std::exception& e) {
        qpdf->error = std::make_shared<QPDFExc>(qpdf_e_internal, "", "", 0, e.what());
        status |= QPDF_ERRORS;
    }

    if (qpdf_more_warnings(qpdf)) {
        status |= QPDF_WARNINGS;
    }
    return status;
}